

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t despace64(char *bytes,size_t howmany)

{
  char cVar1;
  ulong uVar2;
  int local_64;
  char c_1;
  char c;
  int k;
  uint64_t xor3;
  uint64_t xor2;
  uint64_t xor1;
  uint64_t mask3;
  uint64_t mask2;
  uint64_t mask1;
  uint64_t word;
  size_t i;
  size_t pos;
  size_t howmany_local;
  char *bytes_local;
  
  i = 0;
  for (word = 0; word + 7 < howmany; word = word + 8) {
    uVar2 = *(ulong *)(bytes + word);
    if (((((uVar2 ^ 0xd0d0d0d0d0d0d0d) + 0xfefefefefefefeff & (uVar2 ^ 0xf2f2f2f2f2f2f2f2) &
          0x8080808080808080) == 0) &&
        (((uVar2 ^ 0xa0a0a0a0a0a0a0a) + 0xfefefefefefefeff & (uVar2 ^ 0xf5f5f5f5f5f5f5f5) &
         0x8080808080808080) == 0)) &&
       (((uVar2 ^ 0x2020202020202020) + 0xfefefefefefefeff & (uVar2 ^ 0xdfdfdfdfdfdfdfdf) &
        0x8080808080808080) == 0)) {
      *(undefined8 *)(bytes + i) = *(undefined8 *)(bytes + word);
      i = i + 8;
    }
    else {
      for (local_64 = 0; local_64 < 8; local_64 = local_64 + 1) {
        cVar1 = bytes[word + (long)local_64];
        if (((cVar1 != '\r') && (cVar1 != '\n')) && (cVar1 != ' ')) {
          bytes[i] = cVar1;
          i = i + 1;
        }
      }
    }
  }
  for (; word < howmany; word = word + 1) {
    cVar1 = bytes[word];
    if (((cVar1 != '\r') && (cVar1 != '\n')) && (cVar1 != ' ')) {
      bytes[i] = cVar1;
      i = i + 1;
    }
  }
  return i;
}

Assistant:

size_t despace64(char *bytes, size_t howmany) {
  size_t pos = 0;
  size_t i = 0;
  uint64_t word = 0;
  uint64_t mask1 = ~UINT64_C(0) / 255 * (uint64_t)('\r');
  uint64_t mask2 = ~UINT64_C(0) / 255 * (uint64_t)('\n');
  uint64_t mask3 = ~UINT64_C(0) / 255 * (uint64_t)(' ');

  for (; i + 7 < howmany; i += 8) {
    memcpy(&word, bytes + i, sizeof(word));
    uint64_t xor1 = word ^ mask1;
    uint64_t xor2 = word ^ mask2;
    uint64_t xor3 = word ^ mask3;

    if (haszero(xor1) || haszero(xor2) || haszero(xor3)) {
      for (int k = 0; k < 8; k++) {
        char c = bytes[i + k];
        if (c == '\r' || c == '\n' || c == ' ') {
          continue;
        }
        bytes[pos++] = c;
      }

    } else {
      memmove(bytes + pos, bytes + i, sizeof(word));
      pos += 8;
    }
  }

  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}